

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ww.c
# Opt level: O2

void wwShLo(word *a,size_t n,size_t shift)

{
  byte bVar1;
  ulong uVar2;
  ulong uVar3;
  
  if (shift < n << 6) {
    uVar3 = shift >> 6;
    if ((shift & 0x3f) == 0) {
      for (uVar2 = 0; uVar3 + uVar2 < n; uVar2 = uVar2 + 1) {
        a[uVar2] = a[uVar3 + uVar2];
      }
    }
    else {
      for (uVar2 = 1; uVar3 + uVar2 < n; uVar2 = uVar2 + 1) {
        bVar1 = (byte)shift & 0x3f;
        a[uVar2 - 1] = a[uVar3 + (uVar2 - 1)] >> bVar1 | a[uVar3 + uVar2] << 0x40 - bVar1;
      }
      a[uVar2 - 1] = a[uVar3 + (uVar2 - 1)] >> (sbyte)(shift & 0x3f);
    }
    for (; uVar2 < n; uVar2 = uVar2 + 1) {
      a[uVar2] = 0;
    }
    return;
  }
  wwSetZero(a,n);
  return;
}

Assistant:

void wwShLo(word a[], size_t n, size_t shift)
{
	ASSERT(wwIsValid(a, n));
	if (shift < B_PER_W * n)
	{
		size_t wshift = shift / B_PER_W, pos;
		// величина сдвига не кратна длине слова?
		if (shift %= B_PER_W)
		{
			// сдвиг всех слов, кроме последнего
			for (pos = 0; pos + wshift + 1 < n; pos++)
				a[pos] = a[pos + wshift] >> shift |
					a[pos + wshift + 1] << (B_PER_W - shift);
			// последнее слово
			ASSERT(pos + wshift < n);
			a[pos] = a[pos + wshift] >> shift;
			++pos;
		}
		// величина сдвига кратна длине слова
		else for (pos = 0; pos + wshift < n; pos++)
			a[pos] = a[pos + wshift];
		// обнуление последних слов
		for (; pos < n; a[pos++] = 0);
	}
	else
		wwSetZero(a, n);
}